

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall
rlottie::internal::renderer::Polystar::updatePath(Polystar *this,VPath *path,int frameNo)

{
  VPointF VVar1;
  Polystar *pPVar2;
  Direction dir;
  VPathData *pVVar3;
  VMatrix *this_00;
  size_t in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int iVar4;
  undefined4 extraout_EDX_06;
  undefined4 extraout_EDX_07;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int __fd;
  VPath *pVVar5;
  float dx;
  float points;
  float innerRadius;
  float radius;
  float innerRoundness;
  float roundness;
  float a;
  float dy;
  VMatrix local_48;
  
  pPVar2 = this->mData;
  if ((pPVar2->mPos).isValue_ == true) {
    VVar1 = (pPVar2->mPos).impl_.value_;
    dx = VVar1.mx;
    dy = VVar1.my;
    iVar4 = frameNo;
    pVVar5 = path;
  }
  else {
    pVVar5 = (VPath *)(ulong)(uint)frameNo;
    VVar1 = model::KeyFrames<VPointF,_void>::value((pPVar2->mPos).impl_,frameNo);
    dx = VVar1.mx;
    dy = VVar1.my;
    iVar4 = extraout_EDX;
    in_register_00000014 = extraout_var;
  }
  __fd = (int)pVVar5;
  pPVar2 = this->mData;
  if ((pPVar2->mPointCount).isValue_ == true) {
    points = (pPVar2->mPointCount).impl_.value_;
  }
  else {
    __fd = frameNo;
    points = model::KeyFrames<float,_void>::value((pPVar2->mPointCount).impl_,frameNo);
    iVar4 = extraout_EDX_00;
    in_register_00000014 = extraout_var_00;
  }
  pPVar2 = this->mData;
  if ((pPVar2->mInnerRadius).isValue_ == true) {
    innerRadius = (pPVar2->mInnerRadius).impl_.value_;
  }
  else {
    __fd = frameNo;
    innerRadius = model::KeyFrames<float,_void>::value((pPVar2->mInnerRadius).impl_,frameNo);
    iVar4 = extraout_EDX_01;
    in_register_00000014 = extraout_var_01;
  }
  pPVar2 = this->mData;
  if ((pPVar2->mOuterRadius).isValue_ == true) {
    radius = (pPVar2->mOuterRadius).impl_.value_;
  }
  else {
    __fd = frameNo;
    radius = model::KeyFrames<float,_void>::value((pPVar2->mOuterRadius).impl_,frameNo);
    iVar4 = extraout_EDX_02;
    in_register_00000014 = extraout_var_02;
  }
  pPVar2 = this->mData;
  if ((pPVar2->mInnerRoundness).isValue_ == true) {
    innerRoundness = (pPVar2->mInnerRoundness).impl_.value_;
  }
  else {
    __fd = frameNo;
    innerRoundness = model::KeyFrames<float,_void>::value((pPVar2->mInnerRoundness).impl_,frameNo);
    iVar4 = extraout_EDX_03;
    in_register_00000014 = extraout_var_03;
  }
  pPVar2 = this->mData;
  if ((pPVar2->mOuterRoundness).isValue_ == true) {
    roundness = (pPVar2->mOuterRoundness).impl_.value_;
  }
  else {
    __fd = frameNo;
    roundness = model::KeyFrames<float,_void>::value((pPVar2->mOuterRoundness).impl_,frameNo);
    iVar4 = extraout_EDX_04;
    in_register_00000014 = extraout_var_04;
  }
  pPVar2 = this->mData;
  if ((pPVar2->mRotation).isValue_ == true) {
    a = (pPVar2->mRotation).impl_.value_;
  }
  else {
    __fd = frameNo;
    a = model::KeyFrames<float,_void>::value((pPVar2->mRotation).impl_,frameNo);
    iVar4 = extraout_EDX_05;
    in_register_00000014 = extraout_var_05;
  }
  pVVar3 = (VPathData *)
           vcow_ptr<VPath::VPathData>::write
                     (&path->d,__fd,(void *)CONCAT44(in_register_00000014,iVar4),in_RCX);
  VPath::VPathData::reset(pVVar3);
  local_48.m11 = 1.0;
  local_48.m12 = 0.0;
  local_48.m13 = 0.0;
  local_48.m21 = 0.0;
  local_48.m22 = 1.0;
  local_48.m23 = 0.0;
  local_48.mtx = 0.0;
  local_48.mty = 0.0;
  local_48.m33 = 1.0;
  local_48.mType = None;
  local_48.dirty = None;
  iVar4 = *(int *)&(this->mData->super_Shape).field_0x14;
  dir = (Direction)((this->mData->super_Shape).mDirection != 3);
  pVVar3 = (VPathData *)
           vcow_ptr<VPath::VPathData>::write
                     (&path->d,__fd,(void *)CONCAT44(extraout_var_06,extraout_EDX_06),in_RCX);
  if (iVar4 == 1) {
    VPath::VPathData::addPolystar
              (pVVar3,points,innerRadius,radius,innerRoundness,roundness,0.0,0.0,0.0,dir);
  }
  else {
    VPath::VPathData::addPolygon(pVVar3,points,radius,roundness,0.0,0.0,0.0,dir);
  }
  this_00 = VMatrix::translate(&local_48,dx,dy);
  VMatrix::rotate(this_00,a,Z);
  iVar4 = 2;
  VMatrix::rotate(&local_48,a,Z);
  pVVar3 = (VPathData *)
           vcow_ptr<VPath::VPathData>::write
                     (&path->d,iVar4,(void *)CONCAT44(extraout_var_07,extraout_EDX_07),in_RCX);
  VPath::VPathData::transform(pVVar3,&local_48);
  return;
}

Assistant:

void renderer::Polystar::updatePath(VPath &path, int frameNo)
{
    VPointF pos = mData->mPos.value(frameNo);
    float   points = mData->mPointCount.value(frameNo);
    float   innerRadius = mData->mInnerRadius.value(frameNo);
    float   outerRadius = mData->mOuterRadius.value(frameNo);
    float   innerRoundness = mData->mInnerRoundness.value(frameNo);
    float   outerRoundness = mData->mOuterRoundness.value(frameNo);
    float   rotation = mData->mRotation.value(frameNo);

    path.reset();
    VMatrix m;

    if (mData->mPolyType == model::Polystar::PolyType::Star) {
        path.addPolystar(points, innerRadius, outerRadius, innerRoundness,
                         outerRoundness, 0.0, 0.0, 0.0, mData->direction());
    } else {
        path.addPolygon(points, outerRadius, outerRoundness, 0.0, 0.0, 0.0,
                        mData->direction());
    }

    m.translate(pos.x(), pos.y()).rotate(rotation);
    m.rotate(rotation);
    path.transform(m);
}